

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::(anonymous_namespace)::NameFromFieldDescriptor_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  Type TVar1;
  Descriptor *this_00;
  string *psVar2;
  FieldDescriptor *field_local;
  
  TVar1 = FieldDescriptor::type((FieldDescriptor *)this);
  if (TVar1 == TYPE_GROUP) {
    this_00 = FieldDescriptor::message_type((FieldDescriptor *)this);
    psVar2 = Descriptor::name_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  else {
    psVar2 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)this);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string NameFromFieldDescriptor(const FieldDescriptor* field) {
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    return field->message_type()->name();
  } else {
    return field->name();
  }
}